

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

string * __thiscall
t_st_generator::prefix(string *__return_storage_ptr__,t_st_generator *this,string *class_name)

{
  t_program *this_00;
  pointer pcVar1;
  uint *puVar2;
  int iVar3;
  string prefix;
  uint *local_a8;
  size_type local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"smalltalk.prefix","");
  t_program::get_namespace(&local_88,this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pcVar1 = (class_name->_M_dataplus)._M_p;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + class_name->_M_string_length);
  puVar2 = local_a8;
  iVar3 = toupper((int)(char)*local_a8);
  *(char *)puVar2 = (char)iVar3;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_a8 == &local_98) {
    *(uint *)&__return_storage_ptr__->field_2 = local_98;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 4) = uStack_94;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_90;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = uStack_8c;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT44(uStack_94,local_98);
  }
  __return_storage_ptr__->_M_string_length = local_a0;
  local_a0 = 0;
  local_98 = local_98 & 0xffffff00;
  if (local_88._M_string_length == 0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_a8 = &local_98;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  }
  else {
    local_a8 = &local_98;
    std::operator+(&local_68,&local_88,__return_storage_ptr__);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::prefix(string class_name) {
  string prefix = program_->get_namespace("smalltalk.prefix");
  string name = capitalize(class_name);
  name = prefix.empty() ? name : (prefix + name);
  return name;
}